

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O0

void test_subtract(void)

{
  int iVar1;
  size_t i_23;
  size_t i_22;
  size_t i_21;
  size_t i_20;
  size_t i_19;
  size_t i_18;
  size_t i_17;
  size_t i_16;
  size_t i_15;
  size_t i_14;
  size_t i_13;
  size_t i_12;
  size_t i_11;
  size_t i_10;
  size_t i_9;
  size_t i_8;
  size_t i_7;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  int ret;
  quicly_ranges_t ranges;
  long local_f0;
  uint64_t in_stack_ffffffffffffff18;
  uint64_t end;
  uint64_t in_stack_ffffffffffffff20;
  uint64_t start;
  quicly_ranges_t *in_stack_ffffffffffffff28;
  quicly_ranges_t *ranges_00;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  quicly_range_t *in_stack_ffffffffffffffd8;
  undefined4 local_20;
  undefined4 in_stack_ffffffffffffffe4;
  
  quicly_ranges_init((quicly_ranges_t *)&stack0xffffffffffffffd8);
  iVar1 = quicly_ranges_add(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x69
     );
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x6c
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x6d
     );
  for (local_38 = 0; local_38 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_38 = local_38 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_38].start ==
                    test_subtract::expected[local_38].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x6d);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_38].end ==
                    test_subtract::expected[local_38].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x6d);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x70
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x71
     );
  for (local_40 = 0; local_40 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_40 = local_40 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_40].start ==
                    test_subtract::expected_1[local_40].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x71);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_40].end ==
                    test_subtract::expected_1[local_40].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x71);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x74
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x75
     );
  for (local_48 = 0; local_48 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_48 = local_48 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_48].start ==
                    test_subtract::expected_2[local_48].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x75);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_48].end ==
                    test_subtract::expected_2[local_48].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x75);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x78
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x79
     );
  for (local_50 = 0; local_50 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_50 = local_50 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_50].start ==
                    test_subtract::expected_3[local_50].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x79);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_50].end ==
                    test_subtract::expected_3[local_50].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x79);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x7c
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x7d
     );
  for (local_58 = 0; local_58 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_58 = local_58 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_58].start ==
                    test_subtract::expected_4[local_58].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x7d);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_58].end ==
                    test_subtract::expected_4[local_58].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x7d);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x80
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x81
     );
  for (local_60 = 0; local_60 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_60 = local_60 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_60].start ==
                    test_subtract::expected_5[local_60].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x81);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_60].end ==
                    test_subtract::expected_5[local_60].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x81);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x84
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x85
     );
  for (local_68 = 0; local_68 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_68 = local_68 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_68].start ==
                    test_subtract::expected_6[local_68].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x85);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_68].end ==
                    test_subtract::expected_6[local_68].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x85);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x88
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x89
     );
  for (local_70 = 0; local_70 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_70 = local_70 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_70].start ==
                    test_subtract::expected_7[local_70].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x89);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_70].end ==
                    test_subtract::expected_7[local_70].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x89);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x8c
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x8d
     );
  for (local_78 = 0; local_78 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_78 = local_78 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_78].start ==
                    test_subtract::expected_8[local_78].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x8d);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_78].end ==
                    test_subtract::expected_8[local_78].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x8d);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x90
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x91
     );
  for (local_80 = 0; local_80 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_80 = local_80 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_80].start ==
                    test_subtract::expected_9[local_80].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x91);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_80].end ==
                    test_subtract::expected_9[local_80].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x91);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x94
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x95
     );
  for (local_88 = 0; local_88 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_88 = local_88 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_88].start ==
                    test_subtract::expected_10[local_88].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x95);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_88].end ==
                    test_subtract::expected_10[local_88].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x95);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x98
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x99
     );
  for (local_90 = 0; local_90 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_90 = local_90 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_90].start ==
                    test_subtract::expected_11[local_90].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x99);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_90].end ==
                    test_subtract::expected_11[local_90].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x99);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x9c
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0x9d
     );
  for (local_98 = 0; local_98 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_98 = local_98 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_98].start ==
                    test_subtract::expected_12[local_98].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x9d);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_98].end ==
                    test_subtract::expected_12[local_98].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0x9d);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa0
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa1
     );
  for (local_a0 = 0; local_a0 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_a0 = local_a0 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_a0].start ==
                    test_subtract::expected_13[local_a0].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa1);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_a0].end ==
                    test_subtract::expected_13[local_a0].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa1);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa4
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa5
     );
  for (local_a8 = 0; local_a8 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_a8 = local_a8 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_a8].start ==
                    test_subtract::expected_14[local_a8].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa5);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_a8].end ==
                    test_subtract::expected_14[local_a8].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa5);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa8
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xa9
     );
  for (local_b0 = 0; local_b0 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_b0 = local_b0 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_b0].start ==
                    test_subtract::expected_15[local_b0].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa9);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_b0].end ==
                    test_subtract::expected_15[local_b0].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xa9);
  }
  iVar1 = quicly_ranges_add(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xac
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xad
     );
  for (local_b8 = 0; local_b8 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_b8 = local_b8 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_b8].start ==
                    test_subtract::expected_16[local_b8].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xad);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_b8].end ==
                    test_subtract::expected_16[local_b8].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xad);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb0
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb1
     );
  for (local_c0 = 0; local_c0 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_c0 = local_c0 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_c0].start ==
                    test_subtract::expected_17[local_c0].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb1);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_c0].end ==
                    test_subtract::expected_17[local_c0].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb1);
  }
  iVar1 = quicly_ranges_add(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb4
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb5
     );
  for (local_c8 = 0; local_c8 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_c8 = local_c8 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_c8].start ==
                    test_subtract::expected_18[local_c8].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb5);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_c8].end ==
                    test_subtract::expected_18[local_c8].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb5);
  }
  iVar1 = quicly_ranges_subtract
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb8
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xb9
     );
  for (local_d0 = 0; local_d0 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_d0 = local_d0 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_d0].start ==
                    test_subtract::expected_19[local_d0].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb9);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_d0].end ==
                    test_subtract::expected_19[local_d0].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xb9);
  }
  iVar1 = quicly_ranges_add(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xbc
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xbd
     );
  for (ranges_00 = (quicly_ranges_t *)0x0;
      ranges_00 != (quicly_ranges_t *)CONCAT44(in_stack_ffffffffffffffe4,local_20);
      ranges_00 = (quicly_ranges_t *)((long)&ranges_00->ranges + 1)) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[(long)ranges_00].start ==
                    test_subtract::expected_20[(long)ranges_00].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xbd);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[(long)ranges_00].end ==
                    test_subtract::expected_20[(long)ranges_00].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xbd);
  }
  iVar1 = quicly_ranges_subtract(ranges_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc0
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc1
     );
  for (start = 0; start != CONCAT44(in_stack_ffffffffffffffe4,local_20); start = start + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[start].start ==
                    test_subtract::expected_21[start].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc1);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[start].end == test_subtract::expected_21[start].end),
        "%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc1);
  }
  iVar1 = quicly_ranges_add(ranges_00,start,in_stack_ffffffffffffff18);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc4
     );
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc5
     );
  for (end = 0; end != CONCAT44(in_stack_ffffffffffffffe4,local_20); end = end + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[end].start == test_subtract::expected_22[end].start),
        "%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc5);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[end].end == test_subtract::expected_22[end].end),
        "%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc5);
  }
  iVar1 = quicly_ranges_subtract(ranges_00,start,end);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",200)
  ;
  _ok((int)(ulong)(CONCAT44(in_stack_ffffffffffffffe4,local_20) == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",0xc9
     );
  for (local_f0 = 0; local_f0 != CONCAT44(in_stack_ffffffffffffffe4,local_20);
      local_f0 = local_f0 + 1) {
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_f0].start ==
                    test_subtract::expected_23[local_f0].start),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc9);
    _ok((int)(ulong)(in_stack_ffffffffffffffd8[local_f0].end ==
                    test_subtract::expected_23[local_f0].end),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/ranges.c",
        0xc9);
  }
  return;
}

Assistant:

static void test_subtract(void)
{
    quicly_ranges_t ranges;
    int ret;

    quicly_ranges_init(&ranges);

    ret = quicly_ranges_add(&ranges, 100, 200);
    ok(ret == 0);

    ret = quicly_ranges_subtract(&ranges, 0, 50);
    ok(ret == 0);
    CHECK({100, 200});

    ret = quicly_ranges_subtract(&ranges, 0, 100);
    ok(ret == 0);
    CHECK({100, 200});

    ret = quicly_ranges_subtract(&ranges, 250, 300);
    ok(ret == 0);
    CHECK({100, 200});

    ret = quicly_ranges_subtract(&ranges, 200, 300);
    ok(ret == 0);
    CHECK({100, 200});

    ret = quicly_ranges_subtract(&ranges, 100, 110);
    ok(ret == 0);
    CHECK({110, 200});

    ret = quicly_ranges_subtract(&ranges, 120, 130);
    ok(ret == 0);
    CHECK({110, 120}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 120, 130);
    ok(ret == 0);
    CHECK({110, 120}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 121, 129);
    ok(ret == 0);
    CHECK({110, 120}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 119, 120);
    ok(ret == 0);
    CHECK({110, 119}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 118, 120);
    ok(ret == 0);
    CHECK({110, 118}, {130, 200});

    ret = quicly_ranges_subtract(&ranges, 130, 132);
    ok(ret == 0);
    CHECK({110, 118}, {132, 200});

    ret = quicly_ranges_subtract(&ranges, 130, 133);
    ok(ret == 0);
    CHECK({110, 118}, {133, 200});

    ret = quicly_ranges_subtract(&ranges, 118, 134);
    ok(ret == 0);
    CHECK({110, 118}, {134, 200});

    ret = quicly_ranges_subtract(&ranges, 117, 134);
    ok(ret == 0);
    CHECK({110, 117}, {134, 200});

    ret = quicly_ranges_subtract(&ranges, 116, 135);
    ok(ret == 0);
    CHECK({110, 116}, {135, 200});

    ret = quicly_ranges_subtract(&ranges, 110, 140);
    ok(ret == 0);
    CHECK({140, 200});

    ret = quicly_ranges_add(&ranges, 100, 120);
    ok(ret == 0);
    CHECK({100, 120}, {140, 200});

    ret = quicly_ranges_subtract(&ranges, 80, 150);
    ok(ret == 0);
    CHECK({150, 200});

    ret = quicly_ranges_add(&ranges, 100, 120);
    ok(ret == 0);
    CHECK({100, 120}, {150, 200});

    ret = quicly_ranges_subtract(&ranges, 118, 200);
    ok(ret == 0);
    CHECK({100, 118});

    ret = quicly_ranges_add(&ranges, 140, 200);
    ok(ret == 0);
    CHECK({100, 118}, {140, 200});

    ret = quicly_ranges_subtract(&ranges, 118, 240);
    ok(ret == 0);
    CHECK({100, 118});

    ret = quicly_ranges_add(&ranges, 140, 200);
    ok(ret == 0);
    CHECK({100, 118}, {140, 200});

    ret = quicly_ranges_subtract(&ranges, 117, 240);
    ok(ret == 0);
    CHECK({100, 117});
}